

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderConstExprTests.cpp
# Opt level: O0

void deqp::gls::ShaderConstExpr::addOutputVar(ValueBlock *dst,DataType type,float output)

{
  float fVar1;
  int iVar2;
  value_type vVar3;
  long lVar4;
  reference pvVar5;
  VarType local_98;
  reference local_80;
  Value *value;
  Value local_68;
  float local_18;
  DataType local_14;
  float output_local;
  DataType type_local;
  ValueBlock *dst_local;
  
  local_68.elements.
  super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.elements.
  super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.name.field_2._8_8_ = 0;
  local_68.elements.
  super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.name._M_string_length = 0;
  local_68.name.field_2._M_allocated_capacity = 0;
  local_68.type.m_data._8_8_ = 0;
  local_68.name._M_dataplus = (_Alloc_hider)0x0;
  local_68.name._1_7_ = 0;
  local_68.type.m_type = TYPE_BASIC;
  local_68.type._4_4_ = 0;
  local_68.type.m_data.array.elementType = (VarType *)0x0;
  local_18 = output;
  local_14 = type;
  _output_local = dst;
  glu::sl::Value::Value(&local_68);
  std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::push_back(&dst->outputs,&local_68);
  glu::sl::Value::~Value(&local_68);
  local_80 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::back
                       (&_output_local->outputs);
  std::__cxx11::string::operator=((string *)&local_80->name,"out0");
  glu::VarType::VarType(&local_98,local_14,PRECISION_LAST);
  glu::VarType::operator=(&local_80->type,&local_98);
  glu::VarType::~VarType(&local_98);
  std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::resize
            (&local_80->elements,1);
  fVar1 = local_18;
  switch(local_14) {
  case TYPE_FLOAT:
    pvVar5 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
             operator[](&local_80->elements,0);
    pvVar5->float32 = fVar1;
    break;
  default:
    break;
  case TYPE_INT:
    iVar2 = (int)local_18;
    pvVar5 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
             operator[](&local_80->elements,0);
    pvVar5->int32 = iVar2;
    break;
  case TYPE_UINT:
    lVar4 = (long)local_18;
    pvVar5 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
             operator[](&local_80->elements,0);
    pvVar5->int32 = (deInt32)lVar4;
    break;
  case TYPE_BOOL:
    vVar3.int32._1_3_ = 0;
    vVar3.int32._0_1_ = local_18 != 0.0;
    pvVar5 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
             operator[](&local_80->elements,0);
    *pvVar5 = vVar3;
  }
  return;
}

Assistant:

static void addOutputVar (glu::sl::ValueBlock* dst, glu::DataType type, float output)
{
	dst->outputs.push_back(glu::sl::Value());

	{
		glu::sl::Value&	value	= dst->outputs.back();

		value.name	= "out0";
		value.type	= glu::VarType(type, glu::PRECISION_LAST);
		value.elements.resize(1);

		switch (type)
		{
			case glu::TYPE_INT:
				value.elements[0].int32 = (int)output;
				break;

			case glu::TYPE_UINT:
				value.elements[0].int32 = (unsigned int)output;
				break;

			case glu::TYPE_BOOL:
				value.elements[0].bool32 = output!=0.0f;
				break;

			case glu::TYPE_FLOAT:
				value.elements[0].float32 = output;
				break;

			default:
				DE_ASSERT(false);
		}
	}
}